

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string1.cpp
# Opt level: O0

void __thiscall String::String(String *this,String *other)

{
  ostream *this_00;
  size_t sVar1;
  char *pcVar2;
  size_t len;
  String *other_local;
  String *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"String copy constuctor!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  sVar1 = strlen(other->m_data);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  this->m_data = pcVar2;
  strcpy(this->m_data,other->m_data);
  this->m_size = sVar1;
  return;
}

Assistant:

String::String(const String& other)
{
	cout << "String copy constuctor!" << endl;
	size_t len = strlen(other.m_data);
	m_data = new char[len + 1];
	strcpy(m_data, other.m_data);
	m_size = len;
}